

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<bool,_std::allocator<bool>_> *variable,string *value)

{
  bool bVar1;
  bool local_21;
  bool val;
  string *value_local;
  vector<bool,_std::allocator<bool>_> *variable_local;
  CommandLineArguments *this_local;
  
  local_21 = false;
  bVar1 = std::operator==(value,"1");
  if ((((((bVar1) || (bVar1 = std::operator==(value,"ON"), bVar1)) ||
        (bVar1 = std::operator==(value,"on"), bVar1)) ||
       ((bVar1 = std::operator==(value,"On"), bVar1 ||
        (bVar1 = std::operator==(value,"TRUE"), bVar1)))) ||
      ((bVar1 = std::operator==(value,"true"), bVar1 ||
       ((bVar1 = std::operator==(value,"True"), bVar1 ||
        (bVar1 = std::operator==(value,"yes"), bVar1)))))) ||
     ((bVar1 = std::operator==(value,"Yes"), bVar1 || (bVar1 = std::operator==(value,"YES"), bVar1))
     )) {
    local_21 = true;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back(variable,local_21);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  std::vector<bool>* variable, const std::string& value)
{
  bool val = false;
  if ( value == "1" || value == "ON" || value == "on" || value == "On" ||
    value == "TRUE" || value == "true" || value == "True" ||
    value == "yes" || value == "Yes" || value == "YES" )
    {
    val = true;
    }
  variable->push_back(val);
}